

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1f29eed::SatdLpTest_DISABLED_Speed_Test::TestBody
          (SatdLpTest_DISABLED_Speed_Test *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  pointer *__ptr;
  int iVar4;
  SEARCH_METHODS *message;
  int total_simd;
  int total_ref;
  AssertionResult gtest_ar;
  aom_usec_timer c_timer_;
  aom_usec_timer simd_timer_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  AssertHelper local_70;
  int local_68;
  int local_64;
  internal local_60 [8];
  undefined8 *local_58;
  timeval local_50;
  timeval local_40;
  timeval local_30;
  timeval local_20;
  
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::FillRandom
            ((SatdTestBase<short,_int_(*)(const_short_*,_int)> *)this);
  iVar4 = 500000;
  printf("size = %d number of iteration is %d \n",
         (ulong)(uint)(this->super_SatdLpTest).
                      super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_,500000);
  gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  do {
    local_64 = (*(this->super_SatdLpTest).super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.
                 satd_func_ref_)((this->super_SatdLpTest).
                                 super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.src_,
                                 (this->super_SatdLpTest).
                                 super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  iVar4 = 500000;
  do {
    local_68 = (*(this->super_SatdLpTest).super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.
                 satd_func_simd_)((this->super_SatdLpTest).
                                  super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.src_,
                                  (this->super_SatdLpTest).
                                  super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_)
    ;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  lVar2 = local_40.tv_usec - local_50.tv_usec;
  iVar4 = (int)lVar2 + 1000000;
  if (-1 < lVar2) {
    iVar4 = (int)lVar2;
  }
  lVar1 = local_20.tv_usec - local_30.tv_usec;
  iVar3 = (int)lVar1 + 1000000;
  if (-1 < lVar1) {
    iVar3 = (int)lVar1;
  }
  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n",
         (double)((float)(iVar4 + ((int)(lVar2 >> 0x3f) +
                                  ((int)local_40.tv_sec - (int)local_50.tv_sec)) * 1000000) /
                 (float)(iVar3 + ((int)(lVar1 >> 0x3f) +
                                 ((int)local_20.tv_sec - (int)local_30.tv_sec)) * 1000000)));
  testing::internal::CmpHelperEQ<int,int>(local_60,"total_ref","total_simd",&local_64,&local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),"Output mismatch \n",0x11);
    if (local_58 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_58;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x3b6,(char *)message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_58 != local_58 + 2) {
      operator_delete((undefined8 *)*local_58);
    }
    operator_delete(local_58);
  }
  return;
}

Assistant:

TEST_P(SatdLpTest, DISABLED_Speed) {
  FillRandom();
  RunSpeedTest();
}